

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterAllocation.cpp
# Opt level: O2

void colorToRegistersChange
               (AssemblyCommands *commands,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *tempToColorMap,RegisterInfo *registerInfo)

{
  __shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  shared_ptr<AssemblyCode::AssemblyCommand> entry;
  __shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  p_Var1 = &((commands->
             super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
             )._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var2 = &((commands->
                  super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                  )._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>;
      p_Var2 != p_Var1; p_Var2 = p_Var2 + 1) {
    std::__shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,p_Var2);
    (*(local_40._M_ptr)->_vptr_AssemblyCommand[3])(local_40._M_ptr,tempToColorMap,registerInfo);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  return;
}

Assistant:

void colorToRegistersChange(AssemblyCommands& commands,
                            std::map<std::string, int>& tempToColorMap,
                            AssemblyCode::RegisterInfo& registerInfo) {
    for (auto entry : commands) {
        entry->colorToRegisterChange(tempToColorMap, registerInfo);
    }
}